

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O0

bool __thiscall
lunasvg::SVGRadialGradientElement::applyPaint
          (SVGRadialGradientElement *this,SVGRenderState *state,float opacity)

{
  float e;
  float f;
  float a;
  float d;
  bool bVar1;
  Units UVar2;
  SpreadMethod spread;
  SVGLength *length;
  size_type sVar3;
  reference pvVar4;
  Canvas *pCVar5;
  SVGLength *pSVar6;
  Transform *pTVar7;
  int in_ECX;
  void *extraout_RDX;
  char *in_R8;
  int in_R9D;
  float r_00;
  float fx_00;
  float fy_00;
  float cx_00;
  float cy_00;
  Rect RVar8;
  int in_stack_fffffffffffffe48;
  Transform local_114;
  undefined8 local_fc;
  Rect bbox;
  Transform gradientTransform;
  Units gradientUnits;
  SpreadMethod spreadMethod;
  float cy;
  float cx;
  float fy;
  float fx;
  value_type *lastStop;
  float r;
  undefined1 local_a8 [8];
  LengthContext lengthContext;
  undefined1 local_90 [8];
  GradientStops gradientStops;
  SVGGradientElement *gradientContentElement;
  SVGRadialGradientAttributes attributes;
  float opacity_local;
  SVGRenderState *state_local;
  SVGRadialGradientElement *this_local;
  
  attributes.m_fy._4_4_ = opacity;
  collectGradientAttributes((SVGRadialGradientAttributes *)&gradientContentElement,this);
  gradientStops.
  super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)SVGGradientAttributes::gradientContentElement
                          ((SVGGradientAttributes *)&gradientContentElement);
  buildGradientStops((GradientStops *)local_90,
                     (SVGGradientElement *)
                     gradientStops.
                     super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,attributes.m_fy._4_4_);
  bVar1 = std::vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>::empty
                    ((vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_> *)
                     local_90);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    UVar2 = SVGGradientAttributes::gradientUnits((SVGGradientAttributes *)&gradientContentElement);
    LengthContext::LengthContext((LengthContext *)local_a8,(SVGElement *)this,UVar2);
    SVGRadialGradientAttributes::r
              ((SVGRadialGradientAttributes *)&gradientContentElement,this,extraout_RDX,in_ECX,in_R8
               ,in_R9D,in_stack_fffffffffffffe48);
    r_00 = LengthContext::valueForLength((LengthContext *)local_a8,length);
    if (((r_00 == 0.0) && (!NAN(r_00))) ||
       (sVar3 = std::vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>::size
                          ((vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                            *)local_90), sVar3 == 1)) {
      pvVar4 = std::vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>::back
                         ((vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                           *)local_90);
      pCVar5 = SVGRenderState::operator->(state);
      Canvas::setColor(pCVar5,(pvVar4->color).r,(pvVar4->color).g,(pvVar4->color).b,
                       (pvVar4->color).a);
      this_local._7_1_ = true;
    }
    else {
      pSVar6 = SVGRadialGradientAttributes::fx
                         ((SVGRadialGradientAttributes *)&gradientContentElement);
      fx_00 = LengthContext::valueForLength((LengthContext *)local_a8,pSVar6);
      pSVar6 = SVGRadialGradientAttributes::fy
                         ((SVGRadialGradientAttributes *)&gradientContentElement);
      fy_00 = LengthContext::valueForLength((LengthContext *)local_a8,pSVar6);
      pSVar6 = SVGRadialGradientAttributes::cx
                         ((SVGRadialGradientAttributes *)&gradientContentElement);
      cx_00 = LengthContext::valueForLength((LengthContext *)local_a8,pSVar6);
      pSVar6 = SVGRadialGradientAttributes::cy
                         ((SVGRadialGradientAttributes *)&gradientContentElement);
      cy_00 = LengthContext::valueForLength((LengthContext *)local_a8,pSVar6);
      spread = SVGGradientAttributes::spreadMethod((SVGGradientAttributes *)&gradientContentElement)
      ;
      UVar2 = SVGGradientAttributes::gradientUnits((SVGGradientAttributes *)&gradientContentElement)
      ;
      pTVar7 = SVGGradientAttributes::gradientTransform
                         ((SVGGradientAttributes *)&gradientContentElement);
      bbox.w = (pTVar7->m_matrix).a;
      bbox.h = (pTVar7->m_matrix).b;
      if (UVar2 == ObjectBoundingBox) {
        RVar8 = SVGRenderState::fillBoundingBox(state);
        bbox.x = RVar8.w;
        a = bbox.x;
        bbox.y = RVar8.h;
        d = bbox.y;
        local_fc._0_4_ = RVar8.x;
        e = (float)local_fc;
        local_fc._4_4_ = RVar8.y;
        f = local_fc._4_4_;
        local_fc = RVar8._0_8_;
        bbox._0_8_ = RVar8._8_8_;
        Transform::Transform(&local_114,a,0.0,0.0,d,e,f);
        Transform::postMultiply((Transform *)&bbox.w,&local_114);
      }
      pCVar5 = SVGRenderState::operator->(state);
      Canvas::setRadialGradient
                (pCVar5,cx_00,cy_00,r_00,fx_00,fy_00,spread,(GradientStops *)local_90,
                 (Transform *)&bbox.w);
      this_local._7_1_ = true;
    }
  }
  lengthContext._12_4_ = 1;
  std::vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>::~vector
            ((vector<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_> *)local_90);
  return this_local._7_1_;
}

Assistant:

bool SVGRadialGradientElement::applyPaint(SVGRenderState& state, float opacity) const
{
    auto attributes = collectGradientAttributes();
    auto gradientContentElement = attributes.gradientContentElement();
    auto gradientStops = buildGradientStops(gradientContentElement, opacity);
    if(gradientStops.empty())
        return false;
    LengthContext lengthContext(this, attributes.gradientUnits());
    auto r = lengthContext.valueForLength(attributes.r());
    if(r == 0.f || gradientStops.size() == 1) {
        const auto& lastStop = gradientStops.back();
        state->setColor(lastStop.color.r, lastStop.color.g, lastStop.color.b, lastStop.color.a);
        return true;
    }

    auto fx = lengthContext.valueForLength(attributes.fx());
    auto fy = lengthContext.valueForLength(attributes.fy());
    auto cx = lengthContext.valueForLength(attributes.cx());
    auto cy = lengthContext.valueForLength(attributes.cy());

    auto spreadMethod = attributes.spreadMethod();
    auto gradientUnits = attributes.gradientUnits();
    auto gradientTransform = attributes.gradientTransform();
    if(gradientUnits == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        gradientTransform.postMultiply(Transform(bbox.w, 0, 0, bbox.h, bbox.x, bbox.y));
    }

    state->setRadialGradient(cx, cy, r, fx, fy, spreadMethod, gradientStops, gradientTransform);
    return true;
}